

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.hpp
# Opt level: O2

void __thiscall Omega_h::Adj::Adj(Adj *this,LOs *ab2b_,Read<signed_char> *codes_)

{
  Write<int> WStack_28;
  
  Write<int>::Write(&WStack_28,&ab2b_->write_);
  Graph::Graph(&this->super_Graph,(LOs *)&WStack_28);
  Write<int>::~Write(&WStack_28);
  Write<signed_char>::Write(&(this->codes).write_,&codes_->write_);
  return;
}

Assistant:

Adj(LOs ab2b_, Read<I8> codes_) : Graph(ab2b_), codes(codes_) {}